

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece.h
# Opt level: O1

string * __thiscall
StringPiece::AsString_abi_cxx11_(string *__return_storage_ptr__,StringPiece *this)

{
  size_t sVar1;
  char *pcVar2;
  
  sVar1 = this->len_;
  if (sVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar2 = this->str_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AsString() const {
    return len_ ? std::string(str_, len_) : std::string();
  }